

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O1

void Res_WinComputeRoots_rec(Abc_Obj_t *pNode,int nLevelMax,int nFanoutLimit,Vec_Ptr_t *vRoots)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  void **ppvVar6;
  int Fill;
  ulong uVar7;
  long lVar8;
  int iVar9;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,200,"void Res_WinComputeRoots_rec(Abc_Obj_t *, int, int, Vec_Ptr_t *)");
  }
  pAVar4 = pNode->pNtk;
  iVar9 = pNode->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar9 + 1,nFanoutLimit);
  if (((long)iVar9 < 0) || ((pAVar4->vTravIds).nSize <= iVar9)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar5 = pNode->pNtk;
  iVar1 = pAVar5->nTravIds;
  if ((pAVar4->vTravIds).pArray[iVar9] == iVar1) {
    return;
  }
  iVar9 = pNode->Id;
  Vec_IntFillExtra(&pAVar5->vTravIds,iVar9 + 1,Fill);
  if (((long)iVar9 < 0) || ((pAVar5->vTravIds).nSize <= iVar9)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar5->vTravIds).pArray[iVar9] = iVar1;
  uVar2 = (pNode->vFanouts).nSize;
  if ((int)uVar2 <= nFanoutLimit) {
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        uVar3 = *(uint *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[uVar7]] + 0x14);
        if ((nLevelMax < (int)(uVar3 >> 0xc)) || ((uVar3 & 0xf) - 3 < 2)) goto LAB_00468c0e;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    if ((pNode->vFanouts).nSize < 1) {
      return;
    }
    lVar8 = 0;
    do {
      Res_WinComputeRoots_rec
                ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar8]],nLevelMax,
                 nFanoutLimit,vRoots);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pNode->vFanouts).nSize);
    return;
  }
LAB_00468c0e:
  uVar2 = vRoots->nCap;
  if (vRoots->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vRoots->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vRoots->pArray,0x80);
      }
      vRoots->pArray = ppvVar6;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_00468d07;
      if (vRoots->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vRoots->pArray,(ulong)uVar2 << 4);
      }
      vRoots->pArray = ppvVar6;
    }
    vRoots->nCap = iVar9;
  }
LAB_00468d07:
  iVar9 = vRoots->nSize;
  vRoots->nSize = iVar9 + 1;
  vRoots->pArray[iVar9] = pNode;
  return;
}

Assistant:

void Res_WinComputeRoots_rec( Abc_Obj_t * pNode, int nLevelMax, int nFanoutLimit, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pNode) );
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // check if the node should be the root
    if ( Res_WinComputeRootsCheck( pNode, nLevelMax, nFanoutLimit ) )
        Vec_PtrPush( vRoots, pNode );
    else // if not, explore its fanouts
        Abc_ObjForEachFanout( pNode, pFanout, i )
            Res_WinComputeRoots_rec( pFanout, nLevelMax, nFanoutLimit, vRoots );
}